

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_ce1d0::DepsLogTestTruncatedRecovery::Run(DepsLogTestTruncatedRecovery *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  LoadStatus LVar5;
  Node *pNVar6;
  Deps *pDVar7;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  StringPiece path_05;
  StringPiece path_06;
  StringPiece path_07;
  StringPiece path_08;
  StringPiece path_09;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string err;
  DepsLog log;
  State state;
  string local_1e8;
  string local_1c0;
  Node *local_1a0;
  undefined1 local_198 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  pointer local_168;
  pointer ppNStack_160;
  pointer local_158;
  pointer ppDStack_150;
  pointer local_148;
  pointer ppDStack_140;
  State local_138;
  
  State::State(&local_138);
  pTVar2 = g_current_test;
  local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
  local_198._8_8_ = (FILE *)0x0;
  local_198._24_8_ = 0;
  local_178._M_local_buf[0] = '\0';
  local_168 = (pointer)0x0;
  ppNStack_160 = (pointer)0x0;
  local_158 = (pointer)0x0;
  ppDStack_150 = (pointer)0x0;
  local_148 = (pointer)0x0;
  ppDStack_140 = (pointer)0x0;
  paVar1 = &local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1c0._M_dataplus._M_p = (pointer)paVar1;
  local_198._16_8_ = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"DepsLogTest-tempfile","");
  bVar3 = DepsLog::OpenForWrite((DepsLog *)local_198,&local_1e8,&local_1c0);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
             ,0x1a3,"log.OpenForWrite(kTestFilename, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_1c0);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar4 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x1a4,"\"\" == err");
  if (bVar3) {
    local_1e8._M_dataplus._M_p = (pointer)0x0;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_allocated_capacity = 0;
    path.len_ = 5;
    path.str_ = "foo.h";
    local_1a0 = State::GetNode(&local_138,path,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&local_1e8,&local_1a0);
    path_00.len_ = 5;
    path_00.str_ = "bar.h";
    local_1a0 = State::GetNode(&local_138,path_00,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&local_1e8,&local_1a0);
    path_01.len_ = 5;
    path_01.str_ = "out.o";
    pNVar6 = State::GetNode(&local_138,path_01,0);
    DepsLog::RecordDeps((DepsLog *)local_198,pNVar6,1,
                        (vector<Node_*,_std::allocator<Node_*>_> *)&local_1e8);
    if ((pointer)local_1e8._M_string_length != local_1e8._M_dataplus._M_p) {
      local_1e8._M_string_length = (size_type)local_1e8._M_dataplus._M_p;
    }
    path_02.len_ = 5;
    path_02.str_ = "foo.h";
    local_1a0 = State::GetNode(&local_138,path_02,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&local_1e8,&local_1a0);
    path_03.len_ = 6;
    path_03.str_ = "bar2.h";
    local_1a0 = State::GetNode(&local_138,path_03,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&local_1e8,&local_1a0);
    path_04.len_ = 6;
    path_04.str_ = "out2.o";
    pNVar6 = State::GetNode(&local_138,path_04,0);
    DepsLog::RecordDeps((DepsLog *)local_198,pNVar6,2,
                        (vector<Node_*,_std::allocator<Node_*>_> *)&local_1e8);
    DepsLog::Close((DepsLog *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  DepsLog::~DepsLog((DepsLog *)local_198);
  if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
  if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_138.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_138);
  pTVar2 = g_current_test;
  if (!bVar3) {
    return;
  }
  iVar4 = stat("DepsLogTest-tempfile",(stat *)&local_138);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar4 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x1b6,"0 == stat(kTestFilename, &st)");
  pTVar2 = g_current_test;
  if (!bVar3) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  local_198._8_8_ = (FILE *)0x0;
  local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
  local_1c0._M_dataplus._M_p = (pointer)paVar1;
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"DepsLogTest-tempfile","");
  bVar3 = Truncate(&local_1c0,(size_t)((long)&local_138.paths_._M_h._M_single_bucket[-1]._M_nxt + 6)
                   ,(string *)local_198);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x1b8,"Truncate(kTestFilename, st.st_size - 2, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  if (!bVar3) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
  }
  if (!bVar3) {
    return;
  }
  State::State(&local_138);
  pTVar2 = g_current_test;
  local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
  local_198._8_8_ = (FILE *)0x0;
  local_198._24_8_ = 0;
  local_178._M_local_buf[0] = '\0';
  local_168 = (pointer)0x0;
  ppNStack_160 = (pointer)0x0;
  local_158 = (pointer)0x0;
  ppDStack_150 = (pointer)0x0;
  local_148 = (pointer)0x0;
  ppDStack_140 = (pointer)0x0;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1c0._M_dataplus._M_p = (pointer)paVar1;
  local_198._16_8_ = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"DepsLogTest-tempfile","");
  LVar5 = DepsLog::Load((DepsLog *)local_198,&local_1e8,&local_138,&local_1c0);
  testing::Test::Check
            (pTVar2,LVar5 != LOAD_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
             ,0x1c0,"log.Load(kTestFilename, &state, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_1c0);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar4 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x1c1,"\"premature end of file; recovering\" == err");
  pTVar2 = g_current_test;
  if (bVar3) {
    local_1c0._M_string_length = 0;
    *local_1c0._M_dataplus._M_p = '\0';
    path_05.len_ = 6;
    path_05.str_ = "out2.o";
    pNVar6 = State::GetNode(&local_138,path_05,0);
    pDVar7 = DepsLog::GetDeps((DepsLog *)local_198,pNVar6);
    testing::Test::Check
              (pTVar2,pDVar7 == (Deps *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
               ,0x1c5,"NULL == log.GetDeps(state.GetNode(\"out2.o\", 0))");
    pTVar2 = g_current_test;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"DepsLogTest-tempfile","");
    bVar3 = DepsLog::OpenForWrite((DepsLog *)local_198,&local_1e8,&local_1c0);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
               ,0x1c7,"log.OpenForWrite(kTestFilename, &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    iVar4 = std::__cxx11::string::compare((char *)&local_1c0);
    bVar3 = testing::Test::Check
                      (pTVar2,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x1c8,"\"\" == err");
    if (bVar3) {
      local_1e8._M_dataplus._M_p = (pointer)0x0;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity = 0;
      path_06.len_ = 5;
      path_06.str_ = "foo.h";
      local_1a0 = State::GetNode(&local_138,path_06,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_1e8,&local_1a0);
      path_07.len_ = 6;
      path_07.str_ = "bar2.h";
      local_1a0 = State::GetNode(&local_138,path_07,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_1e8,&local_1a0);
      path_08.len_ = 6;
      path_08.str_ = "out2.o";
      pNVar6 = State::GetNode(&local_138,path_08,0);
      DepsLog::RecordDeps((DepsLog *)local_198,pNVar6,3,
                          (vector<Node_*,_std::allocator<Node_*>_> *)&local_1e8);
      DepsLog::Close((DepsLog *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p);
      }
      bVar3 = true;
      goto LAB_00154aa6;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  bVar3 = false;
LAB_00154aa6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  DepsLog::~DepsLog((DepsLog *)local_198);
  if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
  if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_138.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_138);
  if (bVar3) {
    State::State(&local_138);
    pTVar2 = g_current_test;
    local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
    local_198._8_8_ = (FILE *)0x0;
    local_198._24_8_ = 0;
    local_178._M_local_buf[0] = '\0';
    local_168 = (pointer)0x0;
    ppNStack_160 = (pointer)0x0;
    local_158 = (pointer)0x0;
    ppDStack_150 = (pointer)0x0;
    local_148 = (pointer)0x0;
    ppDStack_140 = (pointer)0x0;
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_local_buf[0] = '\0';
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
    local_198._16_8_ = &local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"DepsLogTest-tempfile","");
    LVar5 = DepsLog::Load((DepsLog *)local_198,&local_1e8,&local_138,&local_1c0);
    testing::Test::Check
              (pTVar2,LVar5 != LOAD_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
               ,0x1d9,"log.Load(kTestFilename, &state, &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    path_09.len_ = 6;
    path_09.str_ = "out2.o";
    pNVar6 = State::GetNode(&local_138,path_09,0);
    pDVar7 = DepsLog::GetDeps((DepsLog *)local_198,pNVar6);
    bVar3 = testing::Test::Check
                      (g_current_test,pDVar7 != (Deps *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x1dd,"deps");
    if (!bVar3) {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                               local_1c0.field_2._M_local_buf[0]) + 1);
    }
    DepsLog::~DepsLog((DepsLog *)local_198);
    if (local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_138.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d8ce8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
    ::~_Rb_tree(&local_138.bindings_.rules_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_138.bindings_.bindings_._M_t);
    if (local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
    ::~_Rb_tree(&local_138.pools_._M_t);
    std::
    _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_138);
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, TruncatedRecovery) {
  // Create a file with some entries.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 2, deps);

    log.Close();
  }

  // Shorten the file, corrupting the last record.
  {
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    string err;
    ASSERT_TRUE(Truncate(kTestFilename, st.st_size - 2, &err));
  }

  // Load the file again, add an entry.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));
    ASSERT_EQ("premature end of file; recovering", err);
    err.clear();

    // The truncated entry should've been discarded.
    EXPECT_EQ(NULL, log.GetDeps(state.GetNode("out2.o", 0)));

    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    // Add a new entry.
    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 3, deps);

    log.Close();
  }

  // Load the file a third time to verify appending after a mangled
  // entry doesn't break things.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));

    // The truncated entry should exist.
    DepsLog::Deps* deps = log.GetDeps(state.GetNode("out2.o", 0));
    ASSERT_TRUE(deps);
  }
}